

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sessions.hpp
# Opt level: O0

void __thiscall
ableton::link::
Sessions<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>_&,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::MeasurePeer,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::JoinSessionCallback,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_ableton::platforms::linux::Clock<1>_>
::handleFailedMeasurement
          (Sessions<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>_&,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::MeasurePeer,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::JoinSessionCallback,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_ableton::platforms::linux::Clock<1>_>
           *this,SessionId *id)

{
  bool bVar1;
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> *this_00;
  NullLog *log;
  NullLog *pNVar2;
  Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>
  *this_01;
  double __x;
  const_iterator local_80;
  NodeIdArray local_70;
  Tempo TStack_68;
  Beats BStack_60;
  undefined1 auStack_58 [8];
  undefined8 local_50;
  undefined1 auStack_48 [8];
  undefined1 auStack_40 [8];
  Session *local_38;
  Session *local_30;
  undefined1 local_28 [8];
  pair<__gnu_cxx::__normal_iterator<ableton::link::Session_*,_std::vector<ableton::link::Session,_std::allocator<ableton::link::Session>_>_>,___gnu_cxx::__normal_iterator<ableton::link::Session_*,_std::vector<ableton::link::Session,_std::allocator<ableton::link::Session>_>_>_>
  range;
  SessionId *id_local;
  Sessions<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>_&,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::MeasurePeer,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::JoinSessionCallback,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_ableton::platforms::linux::Clock<1>_>
  *this_local;
  
  range.second._M_current = (Session *)id;
  this_00 = ableton::util::
            Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
            ::operator->(&this->mIo);
  ableton::platforms::asio::
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>::log(this_00,__x);
  pNVar2 = ableton::util::debug(log);
  pNVar2 = ableton::util::operator<<(pNVar2,(char (*) [9])"Session ");
  pNVar2 = ableton::util::operator<<(pNVar2,&(range.second._M_current)->sessionId);
  ableton::util::operator<<(pNVar2,(char (*) [21])" measurement failed.");
  bVar1 = std::operator==((array<unsigned_char,_8UL> *)&this->mCurrent,
                          (array<unsigned_char,_8UL> *)range.second._M_current);
  if (bVar1) {
    scheduleRemeasurement(this);
  }
  else {
    local_30 = (Session *)
               std::
               begin<std::vector<ableton::link::Session,std::allocator<ableton::link::Session>>>
                         (&this->mOtherSessions);
    local_38 = (Session *)
               std::end<std::vector<ableton::link::Session,std::allocator<ableton::link::Session>>>
                         (&this->mOtherSessions);
    local_70._M_elems = *&((range.second._M_current)->sessionId).super_NodeIdArray._M_elems;
    memset(&TStack_68,0,8);
    Tempo::Tempo(&TStack_68);
    memset(&BStack_60,0,8);
    Beats::Beats(&BStack_60);
    memset(auStack_58,0,8);
    local_50 = 0;
    memset(auStack_48,0,8);
    memset(auStack_40,0,8);
    _local_28 = std::
                equal_range<__gnu_cxx::__normal_iterator<ableton::link::Session*,std::vector<ableton::link::Session,std::allocator<ableton::link::Session>>>,ableton::link::Session,ableton::link::Sessions<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,std::reference_wrapper<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionPeerCounter>,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionTimelineCallback>&,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::MeasurePeer,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::JoinSessionCallback,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,ableton::platforms::linux::Clock<1>>::SessionIdComp>
                          (local_30,local_38,&local_70);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<ableton::link::Session_*,_std::vector<ableton::link::Session,_std::allocator<ableton::link::Session>_>_>
                        *)local_28,&range.first);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<ableton::link::Session_const*,std::vector<ableton::link::Session,std::allocator<ableton::link::Session>>>
      ::__normal_iterator<ableton::link::Session*>
                ((__normal_iterator<ableton::link::Session_const*,std::vector<ableton::link::Session,std::allocator<ableton::link::Session>>>
                  *)&local_80,
                 (__normal_iterator<ableton::link::Session_*,_std::vector<ableton::link::Session,_std::allocator<ableton::link::Session>_>_>
                  *)local_28);
      std::vector<ableton::link::Session,_std::allocator<ableton::link::Session>_>::erase
                (&this->mOtherSessions,local_80);
      this_01 = ableton::util::
                Injected<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>_&>
                ::operator->(&this->mPeers);
      Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>
      ::forgetSession(this_01,&(range.second._M_current)->sessionId);
    }
  }
  return;
}

Assistant:

void handleFailedMeasurement(const SessionId& id)
  {
    using namespace std;

    debug(mIo->log()) << "Session " << id << " measurement failed.";

    // if we failed to measure for our current session, schedule a
    // retry in the future. Otherwise, remove the session from our set
    // of known sessions (if it is seen again it will be measured as
    // if new).
    if (mCurrent.sessionId == id)
    {
      scheduleRemeasurement();
    }
    else
    {
      const auto range = equal_range(
        begin(mOtherSessions), end(mOtherSessions), Session{id, {}, {}}, SessionIdComp{});
      if (range.first != range.second)
      {
        mOtherSessions.erase(range.first);
        mPeers->forgetSession(id);
      }
    }
  }